

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O0

void __thiscall BufferedFileWriter::terminate(BufferedFileWriter *this)

{
  undefined1 local_30 [8];
  WriterData data;
  BufferedFileWriter *this_local;
  
  if ((this->m_terminated & 1U) == 0) {
    this->m_terminated = true;
    data._24_8_ = this;
    WriterData::WriterData((WriterData *)local_30);
    data.m_mainFile._0_4_ = 0;
    SafeQueueWithNotification<WriterData>::push
              (&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>,
               (WriterData *)local_30);
    TerminatableThread::join(&this->super_TerminatableThread);
  }
  return;
}

Assistant:

void BufferedFileWriter::terminate()
{
    if (m_terminated)
        return;
    m_terminated = true;
    WriterData data;
    data.m_command = WriterData::Commands::wdNone;
    m_writeQueue.push(data);
    join();
}